

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

numeric * __thiscall
cs_impl::
cni_helper<cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::_call<0>(numeric *__return_storage_ptr__,
          cni_helper<cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,vector *args,sequence<0> *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_310e9938_for_data local_38;
  bool local_28;
  
  pbVar1 = try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mFunc)._M_invoker)((numeric *)&local_38,(_Any_data *)this,pbVar1);
    (__return_storage_ptr__->data)._int = local_38._int;
    *(undefined8 *)((long)&__return_storage_ptr__->data + 8) = local_38._8_8_;
    __return_storage_ptr__->type = local_28;
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}